

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O1

void __thiscall QDeviceDiscoveryUDev::handleUDevNotification(QDeviceDiscoveryUDev *this)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  udev_device *dev;
  char *pcVar8;
  long lVar9;
  udev_device *dev_00;
  storage_type *psVar10;
  char *pcVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x20) == 0) goto LAB_0013507a;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  dev = (udev_device *)udev_monitor_receive_device();
  if (dev != (udev_device *)0x0) {
    pcVar8 = (char *)udev_device_get_action(dev);
    if (pcVar8 != (char *)0x0) {
      lVar9 = udev_device_get_devnode(dev);
      if (lVar9 != 0) {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar11 = psVar10 + lVar9 + 1;
          psVar10 = psVar10 + 1;
        } while (*pcVar11 != '\0');
        QVar12.m_data = psVar10;
        QVar12.m_size = (qsizetype)&local_68;
        QString::fromUtf8(QVar12);
        pcVar4 = local_48.d.ptr;
        pDVar3 = local_48.d.d;
        qVar2 = local_58;
        pQVar1 = local_68;
        local_68 = &(local_48.d.d)->super_QArrayData;
        local_48.d.d = (Data *)pQVar1;
        local_48.d.ptr = pcStack_60;
        pcStack_60 = pcVar4;
        local_58 = local_48.d.size;
        local_48.d.size = qVar2;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        QVar13.m_data = (char *)0x10;
        QVar13.m_size = (qsizetype)&local_48;
        cVar5 = QString::startsWith(QVar13,0x13b5ff);
        if (cVar5 == '\0') {
          QVar14.m_data = (char *)0xd;
          QVar14.m_size = (qsizetype)&local_48;
          cVar5 = QString::startsWith(QVar14,0x13b610);
          if (cVar5 == '\0') goto LAB_0013504f;
          pcVar11 = "drm";
        }
        else {
          pcVar11 = "input";
        }
        bVar6 = checkDeviceType(this,dev);
        if (bVar6) {
LAB_0013500f:
          iVar7 = qstrcmp(pcVar8,"add");
          if (iVar7 == 0) {
            QDeviceDiscovery::deviceDetected((QDeviceDiscovery *)this,&local_48);
          }
          iVar7 = qstrcmp(pcVar8,"remove");
          if (iVar7 == 0) {
            QDeviceDiscovery::deviceRemoved((QDeviceDiscovery *)this,&local_48);
          }
        }
        else {
          dev_00 = (udev_device *)udev_device_get_parent_with_subsystem_devtype(dev,pcVar11,0);
          if (dev_00 != (udev_device *)0x0) {
            bVar6 = checkDeviceType(this,dev_00);
            if (bVar6) goto LAB_0013500f;
          }
        }
      }
    }
  }
LAB_0013504f:
  udev_device_unref(dev);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0013507a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDeviceDiscoveryUDev::handleUDevNotification()
{
    if (!m_udevMonitor)
        return;

    struct udev_device *dev;
    QString devNode;

    dev = udev_monitor_receive_device(m_udevMonitor);
    if (!dev)
        goto cleanup;

    const char *action;
    action = udev_device_get_action(dev);
    if (!action)
        goto cleanup;

    const char *str;
    str = udev_device_get_devnode(dev);
    if (!str)
        goto cleanup;

    const char *subsystem;
    devNode = QString::fromUtf8(str);
    if (devNode.startsWith(QT_EVDEV_DEVICE ""_L1))
        subsystem = "input";
    else if (devNode.startsWith(QT_DRM_DEVICE ""_L1))
        subsystem = "drm";
    else goto cleanup;

    // if we cannot determine a type, walk up the device tree
    if (!checkDeviceType(dev)) {
        // does not increase the refcount
        struct udev_device *parent_dev = udev_device_get_parent_with_subsystem_devtype(dev, subsystem, 0);
        if (!parent_dev)
            goto cleanup;

        if (!checkDeviceType(parent_dev))
            goto cleanup;
    }

    if (qstrcmp(action, "add") == 0)
        emit deviceDetected(devNode);

    if (qstrcmp(action, "remove") == 0)
        emit deviceRemoved(devNode);

cleanup:
    udev_device_unref(dev);
}